

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O0

string * (anonymous_namespace)::expdup_abi_cxx11_(char *str)

{
  int iVar1;
  char *__name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  undefined1 *__s;
  string envname;
  char *envstart;
  bool hasbraces;
  char *next_1;
  char *next;
  size_t addstrlen;
  char *addstr;
  string envval;
  string *output;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defval;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 uVar3;
  size_t local_128;
  size_t local_120;
  undefined1 local_108 [72];
  string local_c0 [55];
  undefined1 local_89 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  byte local_59;
  char *local_58;
  char *local_50;
  size_t local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38 [39];
  byte local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::string(local_38);
  while( true ) {
    if (local_10->_M_dataplus == (_Alloc_hider)0x0) {
      local_11 = 1;
      std::__cxx11::string::~string(local_38);
      if ((local_11 & 1) == 0) {
        std::__cxx11::string::~string((string *)in_RDI);
      }
      return in_RDI;
    }
    if (local_10->_M_dataplus != (_Alloc_hider)0x24) break;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10->field_0x1;
    if (*(char *)pbVar2 == '$') {
      __s = &local_10->field_0x2;
      local_10 = pbVar2;
      local_58 = strchr(__s,0x24);
      local_40 = local_10;
      if (local_58 == (char *)0x0) {
        local_128 = strlen((char *)local_10);
      }
      else {
        local_128 = (long)local_58 - (long)local_10;
      }
      local_48 = local_128;
      local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (&local_10->_M_dataplus + local_128);
      goto LAB_001b7a20;
    }
    local_59 = *(char *)pbVar2 == '{';
    if ((bool)local_59) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_10->field_0x2;
    }
    local_10 = pbVar2;
    local_68 = local_10;
    while( true ) {
      iVar1 = isalnum((int)(char)local_10->_M_dataplus);
      uVar3 = true;
      if (iVar1 == 0) {
        uVar3 = local_10->_M_dataplus == (_Alloc_hider)0x5f;
      }
      if ((bool)uVar3 == false) break;
      local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_10->field_0x1;
    }
    if (((local_59 & 1) == 0) || (local_10->_M_dataplus == (_Alloc_hider)0x7d)) {
      this_00 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_89;
      pbVar2 = local_68;
      defval = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_fffffffffffffed0),&this_00->mHasValue,(char *)defval,
                 (allocator<char> *)pbVar2);
      std::allocator<char>::~allocator((allocator<char> *)local_89);
      if ((local_59 & 1) != 0) {
        local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_10->field_0x1;
      }
      __name = (char *)std::__cxx11::string::c_str();
      al::getenv_abi_cxx11_((al *)(local_108 + 0x20),__name);
      this = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_108;
      std::__cxx11::string::string((string *)this);
      al::optional<std::__cxx11::string>::value_or<std::__cxx11::string>(this_00,defval);
      std::__cxx11::string::operator=(local_38,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string((string *)local_108);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(this);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::data();
      local_48 = std::__cxx11::string::length();
      std::__cxx11::string::~string((string *)(local_89 + 1));
LAB_001b7a20:
      if (local_48 != 0) {
        std::__cxx11::string::append((char *)in_RDI,(ulong)local_40);
      }
    }
  }
  local_50 = strchr((char *)local_10,0x24);
  local_40 = local_10;
  if (local_50 == (char *)0x0) {
    local_120 = strlen((char *)local_10);
  }
  else {
    local_120 = (long)local_50 - (long)local_10;
  }
  local_48 = local_120;
  local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&local_10->_M_dataplus + local_120);
  goto LAB_001b7a20;
}

Assistant:

std::string expdup(const char *str)
{
    std::string output;

    std::string envval;
    while(*str != '\0')
    {
        const char *addstr;
        size_t addstrlen;

        if(str[0] != '$')
        {
            const char *next = std::strchr(str, '$');
            addstr = str;
            addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

            str += addstrlen;
        }
        else
        {
            str++;
            if(*str == '$')
            {
                const char *next = std::strchr(str+1, '$');
                addstr = str;
                addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

                str += addstrlen;
            }
            else
            {
                const bool hasbraces{(*str == '{')};

                if(hasbraces) str++;
                const char *envstart = str;
                while(std::isalnum(*str) || *str == '_')
                    ++str;
                if(hasbraces && *str != '}')
                    continue;
                const std::string envname{envstart, str};
                if(hasbraces) str++;

                envval = al::getenv(envname.c_str()).value_or(std::string{});
                addstr = envval.data();
                addstrlen = envval.length();
            }
        }
        if(addstrlen == 0)
            continue;

        output.append(addstr, addstrlen);
    }

    return output;
}